

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void httplib::detail::skip_content_with_length(Stream *strm,uint64_t len)

{
  int iVar1;
  int extraout_var;
  ulong uVar2;
  ulong uVar3;
  char buf [16384];
  undefined1 auStack_4028 [16384];
  
  uVar3 = 0;
  do {
    uVar2 = len - uVar3;
    if (len < uVar3 || uVar2 == 0) {
      return;
    }
    if (0x3fff < uVar2) {
      uVar2 = 0x4000;
    }
    iVar1 = (*strm->_vptr_Stream[5])(strm,auStack_4028,uVar2);
    uVar3 = uVar3 + CONCAT44(extraout_var,iVar1);
  } while (CONCAT44(extraout_var,iVar1) != 0 && -1 < extraout_var);
  return;
}

Assistant:

inline void skip_content_with_length(Stream &strm, uint64_t len) {
  char buf[CPPHTTPLIB_RECV_BUFSIZ];
  uint64_t r = 0;
  while (r < len) {
    auto read_len = static_cast<size_t>(len - r);
    auto n = strm.read(buf, (std::min)(read_len, CPPHTTPLIB_RECV_BUFSIZ));
    if (n <= 0) { return; }
    r += static_cast<uint64_t>(n);
  }
}